

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O0

int ARKodeSetRelaxSolver(void *arkode_mem,ARKRelaxSolver solver)

{
  int in_ESI;
  ARKodeRelaxMem relax_mem;
  ARKodeMem ark_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffd8;
  ARKodeMem in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = arkRelaxAccessMem((void *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                              (char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                              (ARKodeRelaxMem *)0x18f796);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffe0->step_supports_relaxation == 0) {
      arkProcessError(in_stack_ffffffffffffffe0,-0x30,0x221,"ARKodeSetRelaxSolver",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                      ,"time-stepping module does not support relaxation");
      local_4 = -0x30;
    }
    else if ((in_ESI == 0) || (in_ESI == 1)) {
      *(int *)(in_stack_ffffffffffffffd8 + 0x11) = in_ESI;
      local_4 = 0;
    }
    else {
      arkProcessError(in_stack_ffffffffffffffe0,-0x16,0x228,"ARKodeSetRelaxSolver",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                      ,"An invalid relaxation solver option was provided.");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetRelaxSolver(void* arkode_mem, ARKRelaxSolver solver)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRelaxMem relax_mem;

  retval = arkRelaxAccessMem(arkode_mem, __func__, &ark_mem, &relax_mem);
  if (retval) { return retval; }

  /* Guard against use for time steppers that do not allow relaxation */
  if (!ark_mem->step_supports_relaxation)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  if (solver != ARK_RELAX_BRENT && solver != ARK_RELAX_NEWTON)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "An invalid relaxation solver option was provided.");
    return ARK_ILL_INPUT;
  }

  relax_mem->solver = solver;

  return ARK_SUCCESS;
}